

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O2

void cf_he_ctx_clear(Curl_cfilter *cf,Curl_easy *data)

{
  void *pvVar1;
  long lVar2;
  
  pvVar1 = cf->ctx;
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    baller_free(*(eyeballer **)((long)pvVar1 + lVar2 * 8 + 0x20),data);
    *(undefined8 *)((long)pvVar1 + lVar2 * 8 + 0x20) = 0;
  }
  baller_free(*(eyeballer **)((long)pvVar1 + 0x30),data);
  *(undefined8 *)((long)pvVar1 + 0x30) = 0;
  return;
}

Assistant:

static void cf_he_ctx_clear(struct Curl_cfilter *cf, struct Curl_easy *data)
{
  struct cf_he_ctx *ctx = cf->ctx;
  size_t i;

  DEBUGASSERT(ctx);
  DEBUGASSERT(data);
  for(i = 0; i < ARRAYSIZE(ctx->baller); i++) {
    baller_free(ctx->baller[i], data);
    ctx->baller[i] = NULL;
  }
  baller_free(ctx->winner, data);
  ctx->winner = NULL;
}